

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_extension.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_6aa21::PyIterCtrlPMatchSource<cpsm::FullLineMatch>::fill
          (PyIterCtrlPMatchSource<cpsm::FullLineMatch> *this,
          vector<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
          *items)

{
  pointer *ppPVar1;
  pointer pPVar2;
  size_t sVar3;
  vector<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
  *pvVar4;
  pointer pPVar5;
  int iVar6;
  _object *p_Var7;
  char *pcVar8;
  ulong uVar9;
  pointer pPVar10;
  undefined8 uVar11;
  ulong uVar12;
  pointer pPVar13;
  long lVar14;
  bool bVar15;
  ulong uVar16;
  pointer pPVar17;
  _Head_base<0UL,__object_*,_false> local_70;
  pthread_mutex_t *local_68;
  _Head_base<0UL,__object_*,_false> local_60;
  vector<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
  *local_58;
  long local_50;
  pointer local_48;
  size_t local_40;
  size_t local_38;
  
  local_58 = items;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar6 != 0) {
    uVar11 = std::__throw_system_error(iVar6);
    std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
              ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)&local_70);
    pthread_mutex_unlock(local_68);
    _Unwind_Resume(uVar11);
  }
  if (this->done_ == false) {
    lVar14 = 0;
    local_68 = (pthread_mutex_t *)this;
    do {
      p_Var7 = (_object *)PyIter_Next((PyObject *)local_68[1].__align);
      local_70._M_head_impl = p_Var7;
      if ((p_Var7 == (_object *)0x0) ||
         (local_50 = lVar14, pcVar8 = (char *)PyUnicode_AsUTF8AndSize(p_Var7,&local_38),
         pvVar4 = local_58, pcVar8 == (char *)0x0)) {
        std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                  ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)&local_70);
        *(bool *)((long)local_68 + 0x30) = true;
        this = (PyIterCtrlPMatchSource<cpsm::FullLineMatch> *)local_68;
        goto LAB_00122b8d;
      }
      pPVar2 = (local_58->
               super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pPVar2 == (local_58->
                    super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_40 = local_38;
        pPVar17 = (local_58->
                  super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        lVar14 = (long)pPVar2 - (long)pPVar17;
        if (lVar14 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar9 = (lVar14 >> 3) * -0x5555555555555555;
        uVar12 = uVar9;
        if (pPVar2 == pPVar17) {
          uVar12 = 1;
        }
        uVar16 = uVar12 + uVar9;
        if (0x555555555555554 < uVar16) {
          uVar16 = 0x555555555555555;
        }
        if (CARRY8(uVar12,uVar9)) {
          uVar16 = 0x555555555555555;
        }
        local_48 = pPVar17;
        pPVar10 = (pointer)operator_new(uVar16 * 0x18);
        local_70._M_head_impl = (_object *)0x0;
        *(char **)((long)pPVar10 + lVar14) = pcVar8;
        *(size_t *)((long)pPVar10 + lVar14 + 8) = local_40;
        *(_object **)((long)pPVar10 + lVar14 + 0x10) = p_Var7;
        local_60._M_head_impl = (_object *)0x0;
        std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                  ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)&local_60);
        pPVar5 = local_48;
        pPVar17 = pPVar10;
        for (pPVar13 = local_48; pPVar2 != pPVar13; pPVar13 = pPVar13 + 1) {
          sVar3 = (pPVar13->inner).inner.item_.len_;
          (pPVar17->inner).inner.item_.ptr_ = (pPVar13->inner).inner.item_.ptr_;
          *(size_t *)((long)&(pPVar17->inner).inner.item_ + 8) = sVar3;
          (pPVar17->obj)._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>
          ._M_t = (tuple<_object_*,_(anonymous_namespace)::PyObjectDeleter>)
                  (pPVar13->obj)._M_t.
                  super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>._M_t.
                  super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
                  super__Head_base<0UL,__object_*,_false>._M_head_impl;
          (pPVar13->obj)._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>
          ._M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
          super__Head_base<0UL,__object_*,_false>._M_head_impl = (_object *)0x0;
          std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                    (&pPVar13->obj);
          pPVar17 = pPVar17 + 1;
        }
        if (pPVar5 != (pointer)0x0) {
          operator_delete(pPVar5);
        }
        (local_58->
        super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
        )._M_impl.super__Vector_impl_data._M_start = pPVar10;
        (local_58->
        super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pPVar17 + 1;
        (local_58->
        super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar10 + uVar16;
      }
      else {
        local_70._M_head_impl = (_object *)0x0;
        (pPVar2->inner).inner.item_.ptr_ = pcVar8;
        (pPVar2->inner).inner.item_.len_ = local_38;
        (pPVar2->obj)._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>.
        _M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
        super__Head_base<0UL,__object_*,_false>._M_head_impl = p_Var7;
        local_60._M_head_impl = (_object *)0x0;
        std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                  ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)&local_60);
        ppPVar1 = &(pvVar4->
                   super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FullLineMatch>,_true>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppPVar1 = *ppPVar1 + 1;
      }
      lVar14 = local_50;
      std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                ((unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter> *)&local_70);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x200);
    bVar15 = true;
    this = (PyIterCtrlPMatchSource<cpsm::FullLineMatch> *)local_68;
  }
  else {
LAB_00122b8d:
    bVar15 = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return bVar15;
}

Assistant:

bool fill(std::vector<Item>& items) {
    std::lock_guard<std::mutex> lock(mu_);
    if (done_) {
      return false;
    }
    auto const add_item = [&](PyObjPtr item_obj) {
      if (item_obj == nullptr) {
        return false;
      }
      char* item_data;
      Py_ssize_t item_size;
      if (!PyVimString_AsStringAndSize(item_obj.get(), &item_data,
                                       &item_size)) {
        return false;
      }
      items.emplace_back(
          cpsm::CtrlPItem<cpsm::StringRefItem, MatchMode>(
              (cpsm::StringRefItem(boost::string_ref(item_data, item_size)))),
          std::move(item_obj));
      return true;
    };
    for (Py_ssize_t i = 0; i < batch_size(); i++) {
      if (!add_item(PyObjPtr(PyIter_Next(iter_)))) {
        done_ = true;
        return false;
      }
    }
    return true;
  }